

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O3

Window * __thiscall
s2polyline_alignment::Window::Dilate(Window *__return_storage_ptr__,Window *this,int radius)

{
  pointer pCVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  new_strides;
  allocator_type local_31;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  local_30;
  
  if (-1 < radius) {
    std::
    vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ::vector(&local_30,(long)this->rows_,&local_31);
    uVar3 = (ulong)(uint)this->rows_;
    if (0 < this->rows_) {
      pCVar1 = (this->strides_).
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = 0;
      do {
        uVar5 = (int)lVar4 - radius;
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        iVar2 = (int)uVar3 + -1;
        iVar6 = radius + (int)lVar4;
        if (iVar6 <= iVar2) {
          iVar2 = iVar6;
        }
        iVar6 = pCVar1[uVar5].start - radius;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        iVar2 = pCVar1[iVar2].end + radius;
        if (this->cols_ < iVar2) {
          iVar2 = this->cols_;
        }
        local_30.
        super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar4].start = iVar6;
        local_30.
        super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar4].end = iVar2;
        lVar4 = lVar4 + 1;
        uVar3 = (ulong)this->rows_;
      } while (lVar4 < (long)uVar3);
    }
    Window(__return_storage_ptr__,&local_30);
    if (local_30.
        super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
             ,0x5c,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             local_30.
             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ._M_impl.super__Vector_impl_data._M_finish,"Check failed: radius >= 0 ",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             local_30.
             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ._M_impl.super__Vector_impl_data._M_finish,"Negative dilation radius.",0x19);
  abort();
}

Assistant:

Window Window::Dilate(const int radius) const {
  S2_DCHECK(radius >= 0) << "Negative dilation radius.";
  std::vector<ColumnStride> new_strides(rows_);
  int prev_row, next_row;
  for (int row = 0; row < rows_; ++row) {
    prev_row = std::max(0, row - radius);
    next_row = std::min(row + radius, rows_ - 1);
    new_strides[row] = {std::max(0, strides_[prev_row].start - radius),
                        std::min(strides_[next_row].end + radius, cols_)};
  }
  return Window(new_strides);
}